

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryUnorderedTypeHandler.cpp
# Opt level: O3

bool __thiscall
Js::SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true>::
TryReuseDeletedPropertyIndex
          (SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true> *this,
          DynamicObject *object,int *propertyIndex)

{
  int index;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SimpleDictionaryPropertyDescriptor<int> *pSVar4;
  Var pvVar5;
  char *message;
  char *error;
  int iVar6;
  uint lineNumber;
  
  if (object == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                ,0x46,"(object)","object");
    if (!bVar2) goto LAB_00e3b759;
    *puVar3 = 0;
  }
  if (propertyIndex == (int *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                ,0x47,"(propertyIndex)","propertyIndex");
    if (!bVar2) goto LAB_00e3b759;
    *puVar3 = 0;
  }
  index = this->deletedPropertyIndex;
  if (index == -1) goto LAB_00e3b743;
  pSVar4 = JsUtil::
           BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
           ::GetValueAt((this->
                        super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>).
                        propertyMap.ptr,index);
  iVar6 = pSVar4->propertyIndex;
  if (iVar6 != this->deletedPropertyIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                ,0x4e,
                                "(this->propertyMap->GetValueAt(deletedPropertyIndex).propertyIndex == deletedPropertyIndex)"
                                ,
                                "this->propertyMap->GetValueAt(deletedPropertyIndex).propertyIndex == deletedPropertyIndex"
                               );
    if (!bVar2) goto LAB_00e3b759;
    *puVar3 = 0;
    iVar6 = this->deletedPropertyIndex;
  }
  pSVar4 = JsUtil::
           BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
           ::GetValueAt((this->
                        super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>).
                        propertyMap.ptr,iVar6);
  if ((pSVar4->Attributes & 8) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                ,0x4f,
                                "(this->propertyMap->GetValueAt(deletedPropertyIndex).Attributes & 0x08)"
                                ,
                                "this->propertyMap->GetValueAt(deletedPropertyIndex).Attributes & PropertyDeleted"
                               );
    if (!bVar2) goto LAB_00e3b759;
    *puVar3 = 0;
  }
  iVar6 = this->deletedPropertyIndex;
  *propertyIndex = iVar6;
  pvVar5 = DynamicObject::GetSlot(object,iVar6);
  if (((ulong)pvVar5 & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)pvVar5 & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)pvVar5 & 0xffff000000000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      error = "(Is(aValue))";
      message = "Ensure var is actually a \'TaggedInt\'";
      lineNumber = 0x43;
      goto LAB_00e3b72e;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
LAB_00e3b72e:
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,lineNumber,error,message);
    if (!bVar2) {
LAB_00e3b759:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this->deletedPropertyIndex = (int)pvVar5;
LAB_00e3b743:
  return index != -1;
}

Assistant:

bool SimpleDictionaryUnorderedTypeHandler<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::TryReuseDeletedPropertyIndex(
        DynamicObject *const object,
        TPropertyIndex *const propertyIndex)
    {
        Assert(object);
        Assert(propertyIndex);

        if(deletedPropertyIndex == PropertyIndexRanges<TPropertyIndex>::NoSlots)
        {
            return false;
        }

        Assert(this->propertyMap->GetValueAt(deletedPropertyIndex).propertyIndex == deletedPropertyIndex);
        Assert(this->propertyMap->GetValueAt(deletedPropertyIndex).Attributes & PropertyDeleted);

        *propertyIndex = deletedPropertyIndex;
        deletedPropertyIndex = static_cast<TPropertyIndex>(TaggedInt::ToInt32(object->GetSlot(deletedPropertyIndex)));
        return true;
    }